

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_pHYs(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGInfo *info_local;
  uint local_4;
  
  if (chunkLength == 9) {
    info->phys_defined = 1;
    info->phys_x = (uint)*data * 0x1000000 + (uint)data[1] * 0x10000 + (uint)data[2] * 0x100 +
                   (uint)data[3];
    info->phys_y = (uint)data[4] * 0x1000000 + (uint)data[5] * 0x10000 + (uint)data[6] * 0x100 +
                   (uint)data[7];
    info->phys_unit = (uint)data[8];
    local_4 = 0;
  }
  else {
    local_4 = 0x4a;
  }
  return local_4;
}

Assistant:

static unsigned readChunk_pHYs(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if (chunkLength != 9) return 74; /*invalid pHYs chunk size*/

  info->phys_defined = 1;
  info->phys_x = 16777216u * data[0] + 65536u * data[1] + 256u * data[2] + data[3];
  info->phys_y = 16777216u * data[4] + 65536u * data[5] + 256u * data[6] + data[7];
  info->phys_unit = data[8];

  return 0; /* OK */
}